

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xreq.c
# Opt level: O0

void xreq0_getq_cb(void *arg)

{
  nng_err nVar1;
  nni_msg *msg;
  xreq0_pipe *p;
  void *arg_local;
  
  nVar1 = nni_aio_result((nni_aio *)((long)arg + 0x10));
  if (nVar1 == NNG_OK) {
    msg = nni_aio_get_msg((nni_aio *)((long)arg + 0x10));
    nni_aio_set_msg((nni_aio *)((long)arg + 0x1d8),msg);
    nni_aio_set_msg((nni_aio *)((long)arg + 0x10),(nni_msg *)0x0);
    nni_pipe_send(*arg,(nni_aio *)((long)arg + 0x1d8));
  }
  else {
    nni_pipe_close(*arg);
  }
  return;
}

Assistant:

static void
xreq0_getq_cb(void *arg)
{
	xreq0_pipe *p = arg;

	if (nni_aio_result(&p->aio_getq) != 0) {
		nni_pipe_close(p->pipe);
		return;
	}

	nni_aio_set_msg(&p->aio_send, nni_aio_get_msg(&p->aio_getq));
	nni_aio_set_msg(&p->aio_getq, NULL);

	nni_pipe_send(p->pipe, &p->aio_send);
}